

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::ProgressBar(float fraction,ImVec2 *size_arg,char *overlay)

{
  bool bVar1;
  long in_RSI;
  undefined8 *in_RDI;
  float in_XMM0_Da;
  float fVar2;
  float _x;
  ImVec2 IVar3;
  float in_stack_00000008;
  float in_stack_0000000c;
  float in_stack_00000010;
  ImU32 in_stack_00000014;
  ImRect *in_stack_00000018;
  ImDrawList *in_stack_00000020;
  ImVec2 overlay_size;
  char overlay_buf [32];
  ImVec2 fill_br;
  ImRect bb;
  ImVec2 size;
  ImVec2 pos;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImVec2 *in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff30;
  ImVec2 in_stack_ffffffffffffff38;
  ImDrawList *pIVar4;
  float in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff44;
  ImVec2 in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  ImVec2 *in_stack_ffffffffffffff68;
  ImVec2 *in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff7c;
  float in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff84;
  ImVec2 in_stack_ffffffffffffff88;
  ImVec2 local_60;
  ImRect local_58;
  undefined8 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImGuiStyle *local_30;
  ImGuiContext *local_28;
  ImGuiWindow *local_20;
  
  local_20 = GetCurrentWindow();
  if ((local_20->SkipItems & 1U) == 0) {
    local_28 = GImGui;
    local_30 = &GImGui->Style;
    local_38 = (local_20->DC).CursorPos;
    local_48 = *in_RDI;
    CalcItemWidth();
    local_40 = CalcItemSize(in_stack_ffffffffffffff38,
                            (float)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                            (float)in_stack_ffffffffffffff30);
    local_60 = operator+(in_stack_ffffffffffffff18,(ImVec2 *)0x19dd6e);
    ImRect::ImRect(&local_58,&local_38,&local_60);
    ItemSize((ImVec2 *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             in_stack_ffffffffffffff38.y);
    bVar1 = ItemAdd((ImRect *)in_stack_ffffffffffffff48,(ImGuiID)in_stack_ffffffffffffff44,
                    (ImRect *)in_stack_ffffffffffffff38,
                    (ImGuiItemFlags)((ulong)in_stack_ffffffffffffff30 >> 0x20));
    if (bVar1) {
      fVar2 = ImSaturate(in_XMM0_Da);
      IVar3.y = local_58.Max.y;
      IVar3.x = local_58.Max.x;
      GetColorU32((ImGuiCol)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                  (float)in_stack_ffffffffffffff30);
      RenderFrame(IVar3,in_stack_ffffffffffffff88,(ImU32)in_stack_ffffffffffffff84,
                  SUB41((uint)in_stack_ffffffffffffff80 >> 0x18,0),in_stack_ffffffffffffff7c);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff88,-local_30->FrameBorderSize,
                     -local_30->FrameBorderSize);
      ImRect::Expand(&local_58,(ImVec2 *)&stack0xffffffffffffff88);
      _x = ImLerp<float>(local_58.Min.x,local_58.Max.x,fVar2);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff80,_x,local_58.Max.y);
      pIVar4 = local_20->DrawList;
      GetColorU32((ImGuiCol)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                  (float)in_stack_ffffffffffffff30);
      RenderRectFilledRangeH
                (in_stack_00000020,in_stack_00000018,in_stack_00000014,in_stack_00000010,
                 in_stack_0000000c,in_stack_00000008);
      if (in_RSI == 0) {
        ImFormatString((char *)(double)(fVar2 * 100.0 + 0.01),(size_t)&stack0xffffffffffffff58,
                       (char *)0x20,"%.0f%%");
      }
      IVar3 = CalcTextSize((char *)in_stack_ffffffffffffff48,
                           (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                           SUB81((ulong)pIVar4 >> 0x38,0),SUB84(pIVar4,0));
      if (0.0 < IVar3.x) {
        fVar2 = ImClamp<float>(in_stack_ffffffffffffff80 + (local_30->ItemSpacing).x,local_58.Min.x,
                               (local_58.Max.x - IVar3.x) - (local_30->ItemInnerSpacing).x);
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff48,fVar2,local_58.Min.y);
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff40,0.0,0.5);
        RenderTextClipped(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                          in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(ImVec2 *)IVar3,
                          (ImVec2 *)in_stack_ffffffffffffff48,
                          (ImRect *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      }
    }
  }
  return;
}

Assistant:

void ImGui::ProgressBar(float fraction, const ImVec2& size_arg, const char* overlay)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    ImVec2 pos = window->DC.CursorPos;
    ImVec2 size = CalcItemSize(size_arg, CalcItemWidth(), g.FontSize + style.FramePadding.y * 2.0f);
    ImRect bb(pos, pos + size);
    ItemSize(size, style.FramePadding.y);
    if (!ItemAdd(bb, 0))
        return;

    // Render
    fraction = ImSaturate(fraction);
    RenderFrame(bb.Min, bb.Max, GetColorU32(ImGuiCol_FrameBg), true, style.FrameRounding);
    bb.Expand(ImVec2(-style.FrameBorderSize, -style.FrameBorderSize));
    const ImVec2 fill_br = ImVec2(ImLerp(bb.Min.x, bb.Max.x, fraction), bb.Max.y);
    RenderRectFilledRangeH(window->DrawList, bb, GetColorU32(ImGuiCol_PlotHistogram), 0.0f, fraction, style.FrameRounding);

    // Default displaying the fraction as percentage string, but user can override it
    char overlay_buf[32];
    if (!overlay)
    {
        ImFormatString(overlay_buf, IM_ARRAYSIZE(overlay_buf), "%.0f%%", fraction * 100 + 0.01f);
        overlay = overlay_buf;
    }

    ImVec2 overlay_size = CalcTextSize(overlay, NULL);
    if (overlay_size.x > 0.0f)
        RenderTextClipped(ImVec2(ImClamp(fill_br.x + style.ItemSpacing.x, bb.Min.x, bb.Max.x - overlay_size.x - style.ItemInnerSpacing.x), bb.Min.y), bb.Max, overlay, NULL, &overlay_size, ImVec2(0.0f, 0.5f), &bb);
}